

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void jinit_merged_upsampler(j_decompress_ptr cinfo)

{
  jpeg_upsampler *pjVar1;
  void *pvVar2;
  my_upsample_ptr upsample;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_upsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x58);
  cinfo->upsample = pjVar1;
  pjVar1->start_pass = start_pass_merged_upsample;
  pjVar1->need_context_rows = 0;
  *(JDIMENSION *)((long)&pjVar1[3].start_pass + 4) =
       cinfo->output_width * cinfo->out_color_components;
  if (cinfo->max_v_samp_factor == 2) {
    pjVar1->upsample = merged_2v_upsample;
    pjVar1[1].start_pass = h2v2_merged_upsample;
    pvVar2 = (*cinfo->mem->alloc_large)
                       ((j_common_ptr)cinfo,1,
                        (size_t)*(undefined4 *)((long)&pjVar1[3].start_pass + 4));
    *(void **)&pjVar1[2].need_context_rows = pvVar2;
  }
  else {
    pjVar1->upsample = merged_1v_upsample;
    pjVar1[1].start_pass = h2v1_merged_upsample;
    *(undefined8 *)&pjVar1[2].need_context_rows = 0;
  }
  build_ycc_rgb_table(cinfo);
  return;
}

Assistant:

GLOBAL(void)
jinit_merged_upsampler (j_decompress_ptr cinfo)
{
  my_upsample_ptr upsample;

  upsample = (my_upsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_upsampler));
  cinfo->upsample = (struct jpeg_upsampler *) upsample;
  upsample->pub.start_pass = start_pass_merged_upsample;
  upsample->pub.need_context_rows = FALSE;

  upsample->out_row_width = cinfo->output_width * cinfo->out_color_components;

  if (cinfo->max_v_samp_factor == 2) {
    upsample->pub.upsample = merged_2v_upsample;
    upsample->upmethod = h2v2_merged_upsample;
    /* Allocate a spare row buffer */
    upsample->spare_row = (JSAMPROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
		(size_t) (upsample->out_row_width * SIZEOF(JSAMPLE)));
  } else {
    upsample->pub.upsample = merged_1v_upsample;
    upsample->upmethod = h2v1_merged_upsample;
    /* No spare row needed */
    upsample->spare_row = NULL;
  }

  build_ycc_rgb_table(cinfo);
}